

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainCMakefile(cmGlobalUnixMakefileGenerator3 *this)

{
  bool bVar1;
  byte bVar2;
  cmake *pcVar3;
  string *psVar4;
  reference pvVar5;
  cmLocalUnixMakefileGenerator3 *pcVar6;
  ostream *poVar7;
  LocalGeneratorVector *pLVar8;
  iterator iVar9;
  iterator iVar10;
  reference path;
  reference puVar11;
  pointer pcVar12;
  cmMakefile *pcVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar14;
  string local_518;
  string local_4f8;
  string local_4d8;
  string *local_4b8;
  string *outfile;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *localGen_1;
  iterator __end1_2;
  iterator __begin1_2;
  LocalGeneratorVector *__range1_2;
  string tmpStr;
  string local_438;
  undefined1 local_418 [8];
  string check;
  string *f;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  cmLocalUnixMakefileGenerator3 *lg_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3a8;
  const_iterator local_3a0;
  const_iterator local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_390;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_388;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_380;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  new_end;
  cmake *cm;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *localGen;
  iterator __end1;
  iterator __begin1;
  LocalGeneratorVector *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lfiles;
  cmLocalUnixMakefileGenerator3 *lg;
  string makefileName;
  undefined1 local_2d0 [8];
  cmGeneratedFileStream cmakefileStream;
  string cmakefileName;
  allocator<char> local_31;
  string local_30;
  cmGlobalUnixMakefileGenerator3 *local_10;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CMAKE_SUPPRESS_REGENERATION",&local_31);
  bVar1 = cmGlobalGenerator::GlobalSettingIsOn((cmGlobalGenerator *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  if (!bVar1) {
    pcVar3 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
    psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar3);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[27]>
              ((string *)&cmakefileStream.field_0x260,psVar4,
               (char (*) [27])"/CMakeFiles/Makefile.cmake");
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_2d0,(string *)&cmakefileStream.field_0x260,false,None)
    ;
    bVar2 = std::ios::operator!((ios *)(local_2d0 + (long)*(_func_int **)((long)local_2d0 + -0x18)))
    ;
    if ((bVar2 & 1) == 0) {
      pcVar3 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
      psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar3);
      cmStrCat<std::__cxx11::string_const&,char_const(&)[10]>
                ((string *)&lg,psVar4,(char (*) [10])0xfcd4e0);
      pvVar5 = std::
               vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ::operator[](&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                             LocalGenerators,0);
      pcVar6 = ::cm::
               static_reference_cast<cmLocalUnixMakefileGenerator3,_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_0>
                         (pvVar5);
      cmLocalUnixMakefileGenerator3::WriteDisclaimer(pcVar6,(ostream *)local_2d0);
      poVar7 = std::operator<<((ostream *)local_2d0,"# The generator used is:\n");
      poVar7 = std::operator<<(poVar7,"set(CMAKE_DEPENDS_GENERATOR \"");
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[3])
                (&lfiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar7 = std::operator<<(poVar7,(string *)
                                      &lfiles.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator<<(poVar7,"\")\n\n");
      std::__cxx11::string::~string
                ((string *)
                 &lfiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1);
      pLVar8 = &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators;
      __end1 = std::
               vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ::begin(pLVar8);
      localGen = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
                 std::
                 vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                 ::end(pLVar8);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                         *)&localGen), bVar1) {
        puVar11 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                  ::operator*(&__end1);
        pcVar12 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                  operator->(puVar11);
        pcVar13 = cmLocalGenerator::GetMakefile(pcVar12);
        pvVar14 = cmMakefile::GetListFiles_abi_cxx11_(pcVar13);
        ::cm::
        append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1,pvVar14);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
        ::operator++(&__end1);
      }
      pcVar3 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
      bVar1 = cmake::DoWriteGlobVerifyTarget(pcVar3);
      if (bVar1) {
        psVar4 = cmake::GetGlobVerifyScript_abi_cxx11_(pcVar3);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range1,psVar4);
        psVar4 = cmake::GetGlobVerifyStamp_abi_cxx11_(pcVar3);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range1,psVar4);
      }
      iVar9 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range1);
      iVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1);
      std::
      sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
                (iVar9._M_current,iVar10._M_current);
      local_388._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
      local_390 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range1);
      local_380 = std::
                  unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            (local_388,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )local_390);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_398,&local_380);
      local_3a8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_3a0,&local_3a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1,local_398,local_3a0);
      pvVar5 = std::
               vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ::operator[](&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                             LocalGenerators,0);
      pcVar6 = ::cm::
               static_reference_cast<cmLocalUnixMakefileGenerator3,_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_0>
                         (pvVar5);
      poVar7 = std::operator<<((ostream *)local_2d0,
                               "# The top level Makefile was generated from the following files:\n")
      ;
      poVar7 = std::operator<<(poVar7,"set(CMAKE_MAKEFILE_DEPENDS\n");
      std::operator<<(poVar7,"  \"CMakeCache.txt\"\n");
      __end1_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range1);
      f = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&f), bVar1) {
        path = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1_1);
        poVar7 = std::operator<<((ostream *)local_2d0,"  \"");
        cmOutputConverter::MaybeRelativeToCurBinDir
                  ((string *)((long)&check.field_2 + 8),(cmOutputConverter *)pcVar6,path);
        poVar7 = std::operator<<(poVar7,(string *)(check.field_2._M_local_buf + 8));
        std::operator<<(poVar7,"\"\n");
        std::__cxx11::string::~string((string *)(check.field_2._M_local_buf + 8));
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1_1);
      }
      std::operator<<((ostream *)local_2d0,"  )\n\n");
      pcVar3 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
      psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar3);
      cmStrCat<std::__cxx11::string_const&,char_const(&)[30]>
                ((string *)local_418,psVar4,(char (*) [30])"/CMakeFiles/cmake.check_cache");
      poVar7 = std::operator<<((ostream *)local_2d0,"# The corresponding makefile is:\n");
      poVar7 = std::operator<<(poVar7,"set(CMAKE_MAKEFILE_OUTPUTS\n");
      poVar7 = std::operator<<(poVar7,"  \"");
      cmOutputConverter::MaybeRelativeToCurBinDir
                (&local_438,(cmOutputConverter *)pcVar6,(string *)&lg);
      poVar7 = std::operator<<(poVar7,(string *)&local_438);
      poVar7 = std::operator<<(poVar7,"\"\n");
      poVar7 = std::operator<<(poVar7,"  \"");
      cmOutputConverter::MaybeRelativeToCurBinDir
                ((string *)((long)&tmpStr.field_2 + 8),(cmOutputConverter *)pcVar6,
                 (string *)local_418);
      poVar7 = std::operator<<(poVar7,(string *)(tmpStr.field_2._M_local_buf + 8));
      std::operator<<(poVar7,"\"\n");
      std::__cxx11::string::~string((string *)(tmpStr.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_438);
      std::operator<<((ostream *)local_2d0,"  )\n\n");
      poVar7 = std::operator<<((ostream *)local_2d0,"# Byproducts of CMake generate step:\n");
      std::operator<<(poVar7,"set(CMAKE_MAKEFILE_PRODUCTS\n");
      std::__cxx11::string::string((string *)&__range1_2);
      pLVar8 = &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators;
      __end1_2 = std::
                 vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                 ::begin(pLVar8);
      localGen_1 = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
                   std::
                   vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                   ::end(pLVar8);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1_2,
                                (__normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                 *)&localGen_1), bVar1) {
        puVar11 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                  ::operator*(&__end1_2);
        pcVar12 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                  operator->(puVar11);
        pcVar13 = cmLocalGenerator::GetMakefile(pcVar12);
        pvVar14 = cmMakefile::GetOutputFiles_abi_cxx11_(pcVar13);
        __end2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(pvVar14);
        outfile = (string *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(pvVar14);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&outfile), bVar1) {
          local_4b8 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end2);
          poVar7 = std::operator<<((ostream *)local_2d0,"  \"");
          cmOutputConverter::MaybeRelativeToTopBinDir
                    (&local_4d8,(cmOutputConverter *)pcVar6,local_4b8);
          poVar7 = std::operator<<(poVar7,(string *)&local_4d8);
          std::operator<<(poVar7,"\"\n");
          std::__cxx11::string::~string((string *)&local_4d8);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2);
        }
        pcVar12 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                  operator->(puVar11);
        psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar12);
        cmStrCat<std::__cxx11::string_const&,char_const(&)[44]>
                  (&local_4f8,psVar4,(char (*) [44])"/CMakeFiles/CMakeDirectoryInformation.cmake");
        std::__cxx11::string::operator=((string *)&__range1_2,(string *)&local_4f8);
        std::__cxx11::string::~string((string *)&local_4f8);
        poVar7 = std::operator<<((ostream *)local_2d0,"  \"");
        pcVar12 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                  operator->(puVar11);
        cmOutputConverter::MaybeRelativeToTopBinDir
                  (&local_518,&pcVar12->super_cmOutputConverter,(string *)&__range1_2);
        poVar7 = std::operator<<(poVar7,(string *)&local_518);
        std::operator<<(poVar7,"\"\n");
        std::__cxx11::string::~string((string *)&local_518);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
        ::operator++(&__end1_2);
      }
      std::operator<<((ostream *)local_2d0,"  )\n\n");
      std::__cxx11::string::~string((string *)&__range1_2);
      std::__cxx11::string::~string((string *)local_418);
      WriteMainCMakefileLanguageRules
                (this,(cmGeneratedFileStream *)local_2d0,
                 &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1);
      std::__cxx11::string::~string((string *)&lg);
      makefileName.field_2._12_4_ = 0;
    }
    else {
      makefileName.field_2._12_4_ = 1;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2d0);
    std::__cxx11::string::~string((string *)&cmakefileStream.field_0x260);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteMainCMakefile()
{
  if (this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION")) {
    return;
  }

  // Open the output file.  This should not be copy-if-different
  // because the check-build-system step compares the makefile time to
  // see if the build system must be regenerated.
  std::string cmakefileName =
    cmStrCat(this->GetCMakeInstance()->GetHomeOutputDirectory(),
             "/CMakeFiles/Makefile.cmake");
  cmGeneratedFileStream cmakefileStream(cmakefileName);
  if (!cmakefileStream) {
    return;
  }

  std::string makefileName =
    cmStrCat(this->GetCMakeInstance()->GetHomeOutputDirectory(), "/Makefile");

  {
    // get a local generator for some useful methods
    auto& lg = cm::static_reference_cast<cmLocalUnixMakefileGenerator3>(
      this->LocalGenerators[0]);

    // Write the do not edit header.
    lg.WriteDisclaimer(cmakefileStream);
  }

  // Save the generator name
  cmakefileStream << "# The generator used is:\n"
                  << "set(CMAKE_DEPENDS_GENERATOR \"" << this->GetName()
                  << "\")\n\n";

  // for each cmMakefile get its list of dependencies
  std::vector<std::string> lfiles;
  for (const auto& localGen : this->LocalGenerators) {
    // Get the list of files contributing to this generation step.
    cm::append(lfiles, localGen->GetMakefile()->GetListFiles());
  }

  cmake* cm = this->GetCMakeInstance();
  if (cm->DoWriteGlobVerifyTarget()) {
    lfiles.push_back(cm->GetGlobVerifyScript());
    lfiles.push_back(cm->GetGlobVerifyStamp());
  }

  // Sort the list and remove duplicates.
  std::sort(lfiles.begin(), lfiles.end(), std::less<std::string>());
#if !defined(__VMS) // The Compaq STL on VMS crashes, so accept duplicates.
  auto new_end = std::unique(lfiles.begin(), lfiles.end());
  lfiles.erase(new_end, lfiles.end());
#endif

  {
    // reset lg to the first makefile
    const auto& lg = cm::static_reference_cast<cmLocalUnixMakefileGenerator3>(
      this->LocalGenerators[0]);

    // Save the list to the cmake file.
    cmakefileStream
      << "# The top level Makefile was generated from the following files:\n"
      << "set(CMAKE_MAKEFILE_DEPENDS\n"
      << "  \"CMakeCache.txt\"\n";
    for (std::string const& f : lfiles) {
      cmakefileStream << "  \"" << lg.MaybeRelativeToCurBinDir(f) << "\"\n";
    }
    cmakefileStream << "  )\n\n";

    // Build the path to the cache check file.
    std::string check =
      cmStrCat(this->GetCMakeInstance()->GetHomeOutputDirectory(),
               "/CMakeFiles/cmake.check_cache");

    // Set the corresponding makefile in the cmake file.
    cmakefileStream << "# The corresponding makefile is:\n"
                    << "set(CMAKE_MAKEFILE_OUTPUTS\n"
                    << "  \"" << lg.MaybeRelativeToCurBinDir(makefileName)
                    << "\"\n"
                    << "  \"" << lg.MaybeRelativeToCurBinDir(check) << "\"\n";
    cmakefileStream << "  )\n\n";

    // CMake must rerun if a byproduct is missing.
    cmakefileStream << "# Byproducts of CMake generate step:\n"
                    << "set(CMAKE_MAKEFILE_PRODUCTS\n";

    // add in any byproducts and all the directory information files
    std::string tmpStr;
    for (const auto& localGen : this->LocalGenerators) {
      for (std::string const& outfile :
           localGen->GetMakefile()->GetOutputFiles()) {
        cmakefileStream << "  \"" << lg.MaybeRelativeToTopBinDir(outfile)
                        << "\"\n";
      }
      tmpStr = cmStrCat(localGen->GetCurrentBinaryDirectory(),
                        "/CMakeFiles/CMakeDirectoryInformation.cmake");
      cmakefileStream << "  \"" << localGen->MaybeRelativeToTopBinDir(tmpStr)
                      << "\"\n";
    }
    cmakefileStream << "  )\n\n";
  }

  this->WriteMainCMakefileLanguageRules(cmakefileStream,
                                        this->LocalGenerators);
}